

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
PushUnsafe<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  
  pGVar1 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)this->stackTop_;
  if (pGVar1 == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)0x0) {
    __assert_fail("stackTop_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/internal/stack.h"
                  ,0x81,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericValue<rapidjson::UTF8<>>]"
                 );
  }
  if (pGVar1 + count <=
      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
       *)this->stackEnd_) {
    this->stackTop_ = (char *)(pGVar1 + count);
    return pGVar1;
  }
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/internal/stack.h"
                ,0x82,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericValue<rapidjson::UTF8<>>]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE T* PushUnsafe(size_t count = 1) {
        RAPIDJSON_ASSERT(stackTop_);
        RAPIDJSON_ASSERT(stackTop_ + sizeof(T) * count <= stackEnd_);
        T* ret = reinterpret_cast<T*>(stackTop_);
        stackTop_ += sizeof(T) * count;
        return ret;
    }